

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O1

void xmlSchematronVErr(xmlSchematronValidCtxtPtr ctxt,int error,char *msg,xmlChar *str1)

{
  xmlStructuredErrorFunc schannel;
  int iVar1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  undefined4 in_register_00000034;
  xmlGenericErrorFunc channel;
  
  ctxt->nberrors = ctxt->nberrors + 1;
  channel = ctxt->error;
  schannel = ctxt->serror;
  if (schannel == (xmlStructuredErrorFunc)0x0 && channel == (xmlSchematronValidityErrorFunc)0x0) {
    pp_Var2 = __xmlGenericError();
    channel = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
  }
  else {
    ppvVar3 = &ctxt->userData;
  }
  iVar1 = xmlRaiseError(schannel,channel,*ppvVar3,ctxt,(xmlNode *)0x0,0x11,1,XML_ERR_ERROR,
                        (char *)0x0,0,(char *)0x0,(char *)0x0,(char *)0x0,0,0,
                        (char *)CONCAT44(in_register_00000034,error),0);
  if (-1 < iVar1) {
    return;
  }
  xmlSchematronVErrMemory(ctxt);
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
xmlSchematronVErr(xmlSchematronValidCtxtPtr ctxt, int error,
                  const char *msg, const xmlChar * str1)
{
    xmlGenericErrorFunc channel = NULL;
    xmlStructuredErrorFunc schannel = NULL;
    void *data = NULL;
    int res;

    if (ctxt != NULL) {
        ctxt->nberrors++;
        channel = ctxt->error;
        data = ctxt->userData;
        schannel = ctxt->serror;
    }